

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O1

void __thiscall
SemanticAnalyserTest_InvalidVariableCallThrows_Test::
~SemanticAnalyserTest_InvalidVariableCallThrows_Test
          (SemanticAnalyserTest_InvalidVariableCallThrows_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, InvalidVariableCallThrows)
{
  std::string source = R"SRC(  
  fn main(): f32
  {
    let x: f32 = 2*2 - 4;
    x(1, 2);
    ret 0;
  }
  )SRC";
  throwTest(source);
}